

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

void write_zip(char *zipname,dir_tree_t *trees,int update)

{
  uint num_files;
  int iVar1;
  file_sorted_t *__ptr;
  FILE *__stream;
  FILE *pFVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  file_sorted_t *pfVar10;
  char *__format;
  FILE *pFVar11;
  ulong uVar12;
  bool bVar13;
  BYTE *local_1068;
  EndOfCentralDirectory dirend;
  char tempname [4096];
  
  num_files = count_files(trees);
  __ptr = sort_files(trees,num_files);
  if (__ptr == (file_sorted_t *)0x0) {
    no_mem = 1;
    return;
  }
  if (update == 0) {
    __stream = (FILE *)0x0;
LAB_0010377a:
    pFVar2 = fopen(zipname,"wb");
    local_1068 = (BYTE *)0x0;
  }
  else {
    sprintf(tempname,"%s.temp",zipname);
    __stream = fopen(zipname,"rb");
    pFVar2 = _stderr;
    if (__stream == (FILE *)0x0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar2,"Could not open %s for updating: %s\n",zipname,pcVar7);
LAB_00103968:
      fwrite("Will proceed as if -u had not been specified.\n",0x2e,1,_stderr);
      goto LAB_0010377a;
    }
    local_1068 = find_central_dir((FILE *)__stream);
    if (local_1068 == (BYTE *)0x0) {
      fprintf(_stderr,"Could not read central directory from %s. (Is it a zipfile?)\n",zipname);
      goto LAB_00103968;
    }
    pFVar2 = fopen(tempname,"wb");
  }
  pFVar11 = _stderr;
  if (pFVar2 == (FILE *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    __format = "Could not open %s: %s\n";
LAB_001039e3:
    fprintf(pFVar11,__format,zipname,pcVar7);
  }
  else {
    uVar8 = 0;
    uVar12 = 0;
    pfVar10 = __ptr;
    if (0 < (int)num_files) {
      uVar12 = (ulong)num_files;
    }
    while ((uVar9 = uVar12, uVar12 != uVar8 &&
           (iVar1 = append_to_zip((FILE *)pFVar2,pfVar10,(FILE *)__stream,local_1068), uVar9 = uVar8
           , iVar1 == 0))) {
      uVar8 = uVar8 + 1;
      pfVar10 = pfVar10 + 1;
    }
    if ((uint)uVar9 != num_files) goto LAB_001038c2;
    lVar3 = ftell(pFVar2);
    pfVar10 = __ptr;
    uVar8 = uVar12;
    dirend.DirectoryOffset = (UINT32)lVar3;
    while (bVar13 = uVar8 != 0, uVar8 = uVar8 - 1, bVar13) {
      write_central_dir((FILE *)pFVar2,pfVar10);
      pfVar10 = pfVar10 + 1;
    }
    dirend.Magic = 0x6054b50;
    dirend.DiskNumber = 0;
    dirend.FirstDisk = 0;
    dirend.NumEntries = (WORD)uVar12;
    dirend.NumEntriesOnAllDisks = dirend.NumEntries;
    lVar4 = ftell(pFVar2);
    dirend.DirectorySize = (int)lVar4 - (UINT32)lVar3;
    dirend.ZipCommentLength = 0;
    sVar5 = fwrite(&dirend,0x16,1,pFVar2);
    pFVar11 = _stderr;
    if (sVar5 != 1) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar11,"Failed writing zip directory terminator: %s\n",pcVar7);
    }
    printf("%s contains %d files (updated %d)\n",zipname,(ulong)num_files,(ulong)(uint)UpdateCount);
    fclose(pFVar2);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      iVar1 = remove(zipname);
      pFVar11 = _stderr;
      if (iVar1 != 0) {
        piVar6 = __errno_location();
        zipname = strerror(*piVar6);
        __format = "Could not delete old zip: %s\nUpdated zip can be found at %s\n";
        __stream = (FILE *)0x0;
        pcVar7 = tempname;
        goto LAB_001039e3;
      }
      iVar1 = rename(tempname,zipname);
      pFVar2 = _stderr;
      if (iVar1 != 0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        __stream = (FILE *)0x0;
        fprintf(pFVar2,"Could not rename %s to %s: %s\n",tempname,zipname,pcVar7);
        goto LAB_001038c2;
      }
    }
    __stream = (FILE *)0x0;
  }
LAB_001038c2:
  free(__ptr);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  free(local_1068);
  return;
}

Assistant:

void write_zip(const char *zipname, dir_tree_t *trees, int update)
{
#ifdef _WIN32
	char tempname[_MAX_PATH];
#else
	char tempname[PATH_MAX];
#endif
	EndOfCentralDirectory dirend;
	int i, num_files;
	file_sorted_t *sorted;
	FILE *zip, *ozip = NULL;
	void *central_dir = NULL;

	num_files = count_files(trees);
	sorted = sort_files(trees, num_files);
	if (sorted == NULL)
	{
		no_mem = 1;
		return;
	}
	if (update)
	{
		sprintf(tempname, "%s.temp", zipname);
		ozip = fopen(zipname, "rb");
		if (ozip == NULL)
		{
			fprintf(stderr, "Could not open %s for updating: %s\n", zipname, strerror(errno));
			update = 0;
		}
		else
		{
			central_dir = find_central_dir(ozip);
			if (central_dir == NULL)
			{
				fprintf(stderr, "Could not read central directory from %s. (Is it a zipfile?)\n", zipname);
				update = 0;
			}
		}
		if (!update)
		{
			fprintf(stderr, "Will proceed as if -u had not been specified.\n");
		}
	}
	if (update)
	{
		zip = fopen(tempname, "wb");
	}
	else
	{
		zip = fopen(zipname, "wb");
	}
	if (zip == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", zipname, strerror(errno));
	}
	else
	{
		// Write each file.
		for (i = 0; i < num_files; ++i)
		{
			if (append_to_zip(zip, sorted + i, ozip, central_dir))
			{
				break;
			}
		}
		if (i == num_files)
		{
			// Write central directory.
			dirend.DirectoryOffset = LittleLong(ftell(zip));
			for (i = 0; i < num_files; ++i)
			{
				write_central_dir(zip, sorted + i);
			}
			// Write the directory terminator.
			dirend.Magic = ZIP_ENDOFDIR;
			dirend.DiskNumber = 0;
			dirend.FirstDisk = 0;
			dirend.NumEntriesOnAllDisks = dirend.NumEntries = LittleShort(i);
			// In this case LittleLong(dirend.DirectoryOffset) is undoing the transformation done above.
			dirend.DirectorySize = LittleLong(ftell(zip) - LittleLong(dirend.DirectoryOffset));
			dirend.ZipCommentLength = 0;
			if (fwrite(&dirend, sizeof(dirend), 1, zip) != 1)
			{
				fprintf(stderr, "Failed writing zip directory terminator: %s\n", strerror(errno));
			}
			printf("%s contains %d files (updated %d)\n", zipname, num_files, UpdateCount);
			fclose(zip);

			if (ozip != NULL)
			{
				// Delete original, and rename temp to take its place
				fclose(ozip);
				ozip = NULL;
				if (remove(zipname))
				{
					fprintf(stderr, "Could not delete old zip: %s\nUpdated zip can be found at %s\n",
						strerror(errno), tempname);
				}
				else if (rename(tempname, zipname))
				{
					fprintf(stderr, "Could not rename %s to %s: %s\n",
						tempname, zipname, strerror(errno));
				}
			}
		}
	}
	free(sorted);
	if (ozip != NULL)
	{
		fclose(ozip);
	}
	if (central_dir != NULL)
	{
		free(central_dir);
	}
}